

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardswish_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::HardSwish_x86_avx512::forward_inplace
          (HardSwish_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  undefined4 uVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  _func_int **pp_Var5;
  _func_int *p_Var6;
  undefined1 auVar7 [32];
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 (*pauVar11) [64];
  int iVar12;
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [32];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar22 [16];
  float fVar21;
  undefined1 auVar23 [32];
  
  iVar8 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack;
  uVar10 = 0;
  uVar9 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar9 = uVar10;
  }
  auVar15 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
  auVar18._8_4_ = 0x3f800000;
  auVar18._0_8_ = 0x3f8000003f800000;
  auVar18._12_4_ = 0x3f800000;
  auVar18._16_4_ = 0x3f800000;
  auVar18._20_4_ = 0x3f800000;
  auVar18._24_4_ = 0x3f800000;
  auVar18._28_4_ = 0x3f800000;
  auVar19._8_4_ = 0x3f800000;
  auVar19._0_8_ = 0x3f8000003f800000;
  auVar19._12_4_ = 0x3f800000;
  do {
    if (uVar10 == uVar9) {
      return 0;
    }
    pauVar11 = (undefined1 (*) [64])
               (bottom_top_blob->cstep * uVar10 * bottom_top_blob->elemsize +
               (long)bottom_top_blob->data);
    pp_Var5 = this->_vptr_HardSwish_x86_avx512;
    for (iVar12 = 0; iVar12 + 0xf < iVar8; iVar12 = iVar12 + 0x10) {
      auVar16 = vbroadcastss_avx512f(ZEXT416(*(uint *)(&this->field_0xd0 + (long)pp_Var5[-3])));
      uVar1 = *(undefined4 *)(&this->field_0xd4 + (long)pp_Var5[-3]);
      auVar17._4_4_ = uVar1;
      auVar17._0_4_ = uVar1;
      auVar17._8_4_ = uVar1;
      auVar17._12_4_ = uVar1;
      auVar17._16_4_ = uVar1;
      auVar17._20_4_ = uVar1;
      auVar17._24_4_ = uVar1;
      auVar17._28_4_ = uVar1;
      auVar17._32_4_ = uVar1;
      auVar17._36_4_ = uVar1;
      auVar17._40_4_ = uVar1;
      auVar17._44_4_ = uVar1;
      auVar17._48_4_ = uVar1;
      auVar17._52_4_ = uVar1;
      auVar17._56_4_ = uVar1;
      auVar17._60_4_ = uVar1;
      auVar17 = vfmadd213ps_avx512f(auVar16,*pauVar11,auVar17);
      auVar17 = vmaxps_avx512f(auVar17,ZEXT1664(ZEXT816(0) << 0x40));
      auVar17 = vminps_avx512f(auVar17,auVar15);
      auVar17 = vmulps_avx512f(auVar17,*pauVar11);
      *pauVar11 = auVar17;
      pauVar11 = pauVar11 + 1;
    }
    pp_Var5 = this->_vptr_HardSwish_x86_avx512;
    for (; iVar12 + 7 < iVar8; iVar12 = iVar12 + 8) {
      auVar4 = *(undefined1 (*) [32])*pauVar11;
      uVar1 = *(undefined4 *)(&this->field_0xd0 + (long)pp_Var5[-3]);
      auVar23._4_4_ = uVar1;
      auVar23._0_4_ = uVar1;
      auVar23._8_4_ = uVar1;
      auVar23._12_4_ = uVar1;
      auVar23._16_4_ = uVar1;
      auVar23._20_4_ = uVar1;
      auVar23._24_4_ = uVar1;
      auVar23._28_4_ = uVar1;
      uVar1 = *(undefined4 *)(&this->field_0xd4 + (long)pp_Var5[-3]);
      auVar14._4_4_ = uVar1;
      auVar14._0_4_ = uVar1;
      auVar14._8_4_ = uVar1;
      auVar14._12_4_ = uVar1;
      auVar14._16_4_ = uVar1;
      auVar14._20_4_ = uVar1;
      auVar14._24_4_ = uVar1;
      auVar14._28_4_ = uVar1;
      auVar14 = vfmadd213ps_avx512vl(auVar23,auVar4,auVar14);
      auVar14 = vmaxps_avx(auVar14,ZEXT1632(ZEXT816(0) << 0x40));
      auVar14 = vminps_avx(auVar14,auVar18);
      auVar7._4_4_ = auVar14._4_4_ * auVar4._4_4_;
      auVar7._0_4_ = auVar14._0_4_ * auVar4._0_4_;
      auVar7._8_4_ = auVar14._8_4_ * auVar4._8_4_;
      auVar7._12_4_ = auVar14._12_4_ * auVar4._12_4_;
      auVar7._16_4_ = auVar14._16_4_ * auVar4._16_4_;
      auVar7._20_4_ = auVar14._20_4_ * auVar4._20_4_;
      auVar7._24_4_ = auVar14._24_4_ * auVar4._24_4_;
      auVar7._28_4_ = auVar4._28_4_;
      *(undefined1 (*) [32])*pauVar11 = auVar7;
      pauVar11 = (undefined1 (*) [64])(*pauVar11 + 0x20);
    }
    pp_Var5 = this->_vptr_HardSwish_x86_avx512;
    for (; iVar12 + 3 < iVar8; iVar12 = iVar12 + 4) {
      auVar3 = *(undefined1 (*) [16])*pauVar11;
      uVar1 = *(undefined4 *)(&this->field_0xd0 + (long)pp_Var5[-3]);
      auVar22._4_4_ = uVar1;
      auVar22._0_4_ = uVar1;
      auVar22._8_4_ = uVar1;
      auVar22._12_4_ = uVar1;
      uVar1 = *(undefined4 *)(&this->field_0xd4 + (long)pp_Var5[-3]);
      auVar13._4_4_ = uVar1;
      auVar13._0_4_ = uVar1;
      auVar13._8_4_ = uVar1;
      auVar13._12_4_ = uVar1;
      auVar13 = vfmadd213ps_avx512vl(auVar22,auVar3,auVar13);
      auVar13 = vmaxps_avx(auVar13,ZEXT816(0) << 0x40);
      auVar13 = vminps_avx(auVar13,auVar19);
      auVar20._0_4_ = auVar13._0_4_ * auVar3._0_4_;
      auVar20._4_4_ = auVar13._4_4_ * auVar3._4_4_;
      auVar20._8_4_ = auVar13._8_4_ * auVar3._8_4_;
      auVar20._12_4_ = auVar13._12_4_ * auVar3._12_4_;
      *(undefined1 (*) [16])*pauVar11 = auVar20;
      pauVar11 = (undefined1 (*) [64])(*pauVar11 + 0x10);
    }
    pp_Var5 = this->_vptr_HardSwish_x86_avx512;
    for (; iVar12 < iVar8; iVar12 = iVar12 + 1) {
      fVar2 = *(float *)*pauVar11;
      p_Var6 = pp_Var5[-3];
      fVar21 = 0.0;
      if (fVar2 < *(float *)(&this->field_0xd8 + (long)p_Var6)) {
LAB_00448e3e:
        *(float *)*pauVar11 = fVar21;
      }
      else if (fVar2 <= *(float *)(&this->field_0xdc + (long)p_Var6)) {
        auVar3 = vfmadd213ss_fma(ZEXT416(*(uint *)(&this->field_0xd0 + (long)p_Var6)),
                                 ZEXT416((uint)fVar2),
                                 ZEXT416(*(uint *)(&this->field_0xd4 + (long)p_Var6)));
        fVar21 = auVar3._0_4_ * fVar2;
        goto LAB_00448e3e;
      }
      pauVar11 = (undefined1 (*) [64])(*pauVar11 + 4);
    }
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

int HardSwish_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _zero_avx512 = _mm512_setzero_ps();
        __m512 _one_avx512 = _mm512_set1_ps(1.f);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _ans = _mm512_set1_ps(beta);
            _ans = _mm512_fmadd_ps(_p, _mm512_set1_ps(alpha), _ans);
            _ans = _mm512_max_ps(_ans, _zero_avx512);
            _ans = _mm512_min_ps(_ans, _one_avx512);
            _ans = _mm512_mul_ps(_ans, _p);
            _mm512_storeu_ps(ptr, _ans);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _zero_avx = _mm256_setzero_ps();
        __m256 _one_avx = _mm256_set1_ps(1.f);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _ans = _mm256_set1_ps(beta);
            _ans = _mm256_comp_fmadd_ps(_p, _mm256_set1_ps(alpha), _ans);
            _ans = _mm256_max_ps(_ans, _zero_avx);
            _ans = _mm256_min_ps(_ans, _one_avx);
            _ans = _mm256_mul_ps(_ans, _p);
            _mm256_storeu_ps(ptr, _ans);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _zero = _mm_setzero_ps();
        __m128 _one = _mm_set1_ps(1.f);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _ans = _mm_set1_ps(beta);
            _ans = _mm_add_ps(_mm_mul_ps(_p, _mm_set1_ps(alpha)), _ans);
            _ans = _mm_max_ps(_ans, _zero);
            _ans = _mm_min_ps(_ans, _one);
            _ans = _mm_mul_ps(_ans, _p);
            _mm_store_ps(ptr, _ans);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr < lower)
                *ptr = 0.f;
            else if (*ptr > upper)
                ;
            else
                *ptr = *ptr * (*ptr * alpha + beta);
            ptr++;
        }
    }

    return 0;
}